

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double normalinv(double p,double mu,double sigma)

{
  double dVar1;
  double dVar2;
  double t;
  double oup;
  double sigma_local;
  double mu_local;
  double p_local;
  
  if (sigma < 0.0) {
    printf("Standard Deviation (Sigma) must be non-negative");
    exit(1);
  }
  if (0.0 <= p) {
    if (p <= 1.0) {
      dVar1 = sqrt(2.0);
      dVar2 = erfinv(p + p + -1.0);
      return dVar1 * dVar2 * sigma + mu;
    }
  }
  printf("Probablity Values can only take values between 0.0 and 1.0");
  exit(1);
}

Assistant:

double normalinv(double p, double mu, double sigma) {
	double oup,t;
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	t = sqrt(2.0) * erfinv(2.0 * p - 1.0);
	oup = t * sigma + mu;
	
	return oup;
}